

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation
          (FoldSpecConstantOpAndCompositePass *this,inst_iterator *pos)

{
  IRContext *this_00;
  ConstantManager *this_01;
  Operand *pOVar1;
  Type *type;
  Type *type_00;
  bool bVar2;
  Op opcode;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstructionFolder *pIVar5;
  Constant *pCVar6;
  Instruction *pIVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  __it;
  __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  _Var8;
  long lVar9;
  pointer puVar10;
  long lVar11;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  result_vector_components;
  Constant *rc;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  operands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_vec;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_b8;
  Type *local_a0;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  _Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false> local_70;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pIVar7 = (pos->super_iterator).node_;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  local_a0 = analysis::ConstantManager::GetType(this_01,pIVar7);
  uVar4 = (pIVar7->has_result_id_ & 1) + 1;
  if (pIVar7->has_type_id_ == false) {
    uVar4 = (uint)pIVar7->has_result_id_;
  }
  opcode = Instruction::GetSingleWordOperand(pIVar7,uVar4);
  local_98._0_8_ = &local_68;
  local_68.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __it._M_current =
       (pIVar7->operands_).
       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
       super__Vector_impl_data._M_start;
  pOVar1 = (pIVar7->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pOVar1 - (long)__it._M_current;
  lVar11 = (lVar9 >> 4) * -0x5555555555555555 >> 2;
  local_98._8_8_ = this;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it);
      _Var8._M_current = __it._M_current;
      if (bVar2) goto LAB_005b5436;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_005b5436;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_005b5436;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_005b5436;
      __it._M_current = __it._M_current + 4;
      lVar11 = lVar11 + -1;
      lVar9 = lVar9 + -0xc0;
    } while (1 < lVar11);
  }
  lVar9 = (lVar9 >> 4) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_005b5420:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
            ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                          *)local_98,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar2) {
      _Var8._M_current = pOVar1;
    }
LAB_005b5436:
    if (_Var8._M_current == pOVar1) goto LAB_005b5442;
  }
  else {
    if (lVar9 == 2) {
LAB_005b5407:
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it);
      _Var8._M_current = __it._M_current;
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_005b5420;
      }
      goto LAB_005b5436;
    }
    if (lVar9 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::$_0>
              ::operator()((_Iter_negate<spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                            *)local_98,__it);
      _Var8._M_current = __it._M_current;
      if (!bVar2) {
        __it._M_current = __it._M_current + 1;
        goto LAB_005b5407;
      }
      goto LAB_005b5436;
    }
LAB_005b5442:
    type_00 = local_a0;
    iVar3 = (*local_a0->_vptr_Type[10])(local_a0);
    if ((CONCAT44(extraout_var,iVar3) != 0) ||
       (iVar3 = (*type_00->_vptr_Type[8])(type_00), CONCAT44(extraout_var_00,iVar3) != 0)) {
      pIVar5 = IRContext::get_instruction_folder((this->super_Pass).context_);
      uVar4 = InstructionFolder::FoldScalars(pIVar5,opcode,&local_68);
      anon_unknown_14::EncodeIntegerAsWords
                ((SmallVector<unsigned_int,_2UL> *)local_98,type_00,uVar4);
      pCVar6 = analysis::ConstantManager::
               GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                         (this_01,type_00,(SmallVector<unsigned_int,_2UL> *)local_98);
      local_98._0_8_ = &PTR__SmallVector_00930a20;
      if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_78,local_78._M_head_impl);
      }
      pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule(this_01,pCVar6,pos,0);
      goto LAB_005b54dc;
    }
    iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
      type = *(Type **)(CONCAT44(extraout_var_02,iVar3) + 0x28);
      iVar3 = (*type_00->_vptr_Type[0xe])(type_00);
      uVar4 = *(uint32_t *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
      pIVar5 = IRContext::get_instruction_folder((this->super_Pass).context_);
      InstructionFolder::FoldVectors(&local_48,pIVar5,opcode,uVar4,&local_68);
      local_b8.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (Constant **)0x0;
      local_b8.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (Constant **)0x0;
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar10 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          anon_unknown_14::EncodeIntegerAsWords
                    ((SmallVector<unsigned_int,_2UL> *)local_98,type,*puVar10);
          pCVar6 = analysis::ConstantManager::
                   GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                             (this_01,type,(SmallVector<unsigned_int,_2UL> *)local_98);
          local_98._0_8_ = &PTR__SmallVector_00930a20;
          if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_78,local_78._M_head_impl);
          }
          local_98._0_8_ = pCVar6;
          if (pCVar6 == (Constant *)0x0) {
            __assert_fail("false && \"Failed to create constants with 32-bit word\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                          ,0x13a,
                          "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                         );
          }
          if (local_b8.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
            ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                      ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                        *)&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Constant **)local_98);
          }
          else {
            *local_b8.
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = pCVar6;
            local_b8.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule
                             (this_01,(Constant *)local_98._0_8_,pos,0);
          if (pIVar7 == (Instruction *)0x0) {
            __assert_fail("false && \"Failed to build and insert constant declaring instruction \" \"for the given vector component constant\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                          ,0x137,
                          "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                         );
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 !=
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar3 = (*local_a0->_vptr_Type[0xe])();
      pCVar6 = (Constant *)operator_new(0x30);
      pCVar6->type_ = (Type *)CONCAT44(extraout_var_04,iVar3);
      pCVar6->_vptr_Constant = (_func_int **)&PTR__CompositeConstant_00937850;
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)(pCVar6 + 1),&local_b8);
      pCVar6->_vptr_Constant = (_func_int **)&PTR__CompositeConstant_00937748;
      pCVar6[2].type_ = (Type *)((Type *)CONCAT44(extraout_var_04,iVar3))[1]._vptr_Type;
      local_70._M_head_impl = pCVar6;
      pCVar6 = analysis::ConstantManager::RegisterConstant
                         (this_01,(unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
                                   *)&local_70);
      if (local_70._M_head_impl != (Constant *)0x0) {
        (*(local_70._M_head_impl)->_vptr_Constant[1])();
      }
      local_70._M_head_impl = (Constant *)0x0;
      pIVar7 = analysis::ConstantManager::BuildInstructionAndAddToModule(this_01,pCVar6,pos,0);
      if (local_b8.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint32_t *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_005b54dc;
    }
  }
  pIVar7 = (Instruction *)0x0;
LAB_005b54dc:
  if (local_68.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pIVar7;
}

Assistant:

Instruction* FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(
    Module::inst_iterator* pos) {
  const Instruction* inst = &**pos;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* result_type = const_mgr->GetType(inst);
  spv::Op spec_opcode = static_cast<spv::Op>(inst->GetSingleWordInOperand(0));
  // Check and collect operands.
  std::vector<const analysis::Constant*> operands;

  if (!std::all_of(
          inst->cbegin(), inst->cend(), [&operands, this](const Operand& o) {
            // skip the operands that is not an id.
            if (o.type != spv_operand_type_t::SPV_OPERAND_TYPE_ID) return true;
            uint32_t id = o.words.front();
            if (auto c =
                    context()->get_constant_mgr()->FindDeclaredConstant(id)) {
              if (IsValidTypeForComponentWiseOperation(c->type())) {
                operands.push_back(c);
                return true;
              }
            }
            return false;
          }))
    return nullptr;

  if (result_type->AsInteger() || result_type->AsBool()) {
    // Scalar operation
    const uint32_t result_val =
        context()->get_instruction_folder().FoldScalars(spec_opcode, operands);
    auto result_const = const_mgr->GetConstant(
        result_type, EncodeIntegerAsWords(*result_type, result_val));
    return const_mgr->BuildInstructionAndAddToModule(result_const, pos);
  } else if (result_type->AsVector()) {
    // Vector operation
    const analysis::Type* element_type =
        result_type->AsVector()->element_type();
    uint32_t num_dims = result_type->AsVector()->element_count();
    std::vector<uint32_t> result_vec =
        context()->get_instruction_folder().FoldVectors(spec_opcode, num_dims,
                                                        operands);
    std::vector<const analysis::Constant*> result_vector_components;
    for (const uint32_t r : result_vec) {
      if (auto rc = const_mgr->GetConstant(
              element_type, EncodeIntegerAsWords(*element_type, r))) {
        result_vector_components.push_back(rc);
        if (!const_mgr->BuildInstructionAndAddToModule(rc, pos)) {
          assert(false &&
                 "Failed to build and insert constant declaring instruction "
                 "for the given vector component constant");
        }
      } else {
        assert(false && "Failed to create constants with 32-bit word");
      }
    }
    auto new_vec_const = MakeUnique<analysis::VectorConstant>(
        result_type->AsVector(), result_vector_components);
    auto reg_vec_const = const_mgr->RegisterConstant(std::move(new_vec_const));
    return const_mgr->BuildInstructionAndAddToModule(reg_vec_const, pos);
  } else {
    // Cannot process invalid component wise operation. The result of component
    // wise operation must be of integer or bool scalar or vector of
    // integer/bool type.
    return nullptr;
  }
}